

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *__s;
  bool bVar1;
  bool local_63;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string test_name;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  if (1 < argc) {
    __s = argv[1];
    test_name.field_2._8_8_ = argv;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_38,__s,&local_39);
    std::allocator<char>::~allocator(&local_39);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_38,"example");
    if (bVar1) {
      bVar1 = run_json_example();
      local_63 = false;
      if (bVar1) {
        local_63 = run_msgpack_example();
      }
      argv_local._4_4_ = (uint)(local_63 == false);
      bVar1 = true;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_38,"simple");
      if (bVar1) {
        bVar1 = run_simple_msgpack_test();
        argv_local._4_4_ = (uint)!bVar1;
        bVar1 = true;
      }
      else {
        bVar1 = false;
      }
    }
    std::__cxx11::string::~string((string *)local_38);
    if (bVar1) {
      return argv_local._4_4_;
    }
  }
  return 1;
}

Assistant:

int main(int argc, char** argv)
{

  if (argc > 1)
  {
    std::string test_name = argv[1];
    if (test_name == "example")
      return (run_json_example() && run_msgpack_example() ? EXIT_SUCCESS : EXIT_FAILURE);
    else if (test_name == "simple")
      return (run_simple_msgpack_test() ? EXIT_SUCCESS : EXIT_FAILURE);
  }

  return EXIT_FAILURE;
}